

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexchange.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Options *this;
  Options *var;
  ostream *poVar3;
  undefined8 *in_RSI;
  char **in_stack_000000e0;
  int in_stack_000000ec;
  Options *in_stack_000000f0;
  Options ops;
  bool help;
  Session session;
  communicator world;
  environment env;
  undefined4 in_stack_fffffffffffffc18;
  int in_stack_fffffffffffffc1c;
  Session *in_stack_fffffffffffffc20;
  string *psVar4;
  allocator<char> *in_stack_fffffffffffffc50;
  string *l;
  char *in_stack_fffffffffffffc58;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  Options *ops_00;
  ostream *out;
  allocator<char> *var_00;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  string local_368 [7];
  char in_stack_fffffffffffffc9f;
  undefined1 local_341 [48];
  undefined1 local_311 [40];
  allocator<char> local_2e9;
  string local_2e8 [47];
  undefined1 local_2b9 [40];
  ostream local_291;
  string local_290 [47];
  undefined1 local_261 [40];
  allocator<char> local_239;
  string local_238 [88];
  Session *in_stack_fffffffffffffe20;
  byte local_1d1;
  communicator local_30;
  undefined8 *local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  diy::mpi::environment::environment
            ((environment *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c,(char **)0x14c9ed);
  diy::mpi::communicator::communicator((communicator *)in_stack_fffffffffffffc20);
  Catch::Session::Session(in_stack_fffffffffffffe20);
  opts::Options::Options((Options *)in_stack_fffffffffffffc20);
  var_00 = &local_239;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  psVar4 = (string *)local_261;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  opts::Option<int>(in_stack_fffffffffffffc9f,
                    (string *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                    (int *)var_00,psVar4);
  opts::Options::operator>>
            ((Options *)in_stack_fffffffffffffc20,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  out = &local_291;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  ops_00 = (Options *)local_2b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  opts::Option<int>(in_stack_fffffffffffffc9f,
                    (string *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                    (int *)var_00,psVar4);
  this = opts::Options::operator>>
                   ((Options *)in_stack_fffffffffffffc20,
                    (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                    CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  __s = &local_2e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,(char *)__s,
             in_stack_fffffffffffffc50);
  l = (string *)local_311;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,(char *)__s,
             (allocator<char> *)l);
  opts::Option<int>(in_stack_fffffffffffffc9f,
                    (string *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                    (int *)var_00,psVar4);
  var = opts::Options::operator>>
                  ((Options *)in_stack_fffffffffffffc20,
                   (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                   CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  psVar4 = (string *)local_341;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,(char *)__s,
             (allocator<char> *)l);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,(char *)__s,
             (allocator<char> *)l);
  opts::Option<bool>((char)((ulong)__s >> 0x38),l,(bool *)var,psVar4);
  opts::Options::operator>>
            ((Options *)in_stack_fffffffffffffc20,
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  Catch::clara::std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::
  ~unique_ptr((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
              in_stack_fffffffffffffc20);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc97);
  std::__cxx11::string::~string((string *)(local_341 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_341);
  Catch::clara::std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::
  ~unique_ptr((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
              in_stack_fffffffffffffc20);
  std::__cxx11::string::~string((string *)(local_311 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_311);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  Catch::clara::std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::
  ~unique_ptr((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
              in_stack_fffffffffffffc20);
  std::__cxx11::string::~string((string *)(local_2b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2b9);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  Catch::clara::std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::
  ~unique_ptr((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
              in_stack_fffffffffffffc20);
  std::__cxx11::string::~string((string *)(local_261 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_261);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  bVar1 = opts::Options::parse(in_stack_000000f0,in_stack_000000ec,in_stack_000000e0);
  if ((bVar1) && ((local_1d1 & 1) == 0)) {
    local_4 = Catch::Session::run(in_stack_fffffffffffffc20);
  }
  else {
    iVar2 = diy::mpi::communicator::rank(&local_30);
    if (iVar2 == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Usage: ");
      in_stack_fffffffffffffc20 = (Session *)std::operator<<(poVar3,(char *)*local_10);
      std::operator<<((ostream *)in_stack_fffffffffffffc20," [OPTIONS]\n");
      std::operator<<((ostream *)&std::cout,"Sends and receives messages outside of the link.\n");
      opts::operator<<(out,ops_00);
    }
    local_4 = 1;
  }
  opts::Options::~Options((Options *)in_stack_fffffffffffffc20);
  Catch::Session::~Session(in_stack_fffffffffffffc20);
  diy::mpi::communicator::~communicator((communicator *)0x14d1ad);
  diy::mpi::environment::~environment((environment *)0x14d1ba);
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
    diy::mpi::environment     env(argc, argv);
    diy::mpi::communicator    world;

    Catch::Session session;

    bool help;

    // get command line arguments
    using namespace opts;
    Options ops;
    ops
        >> Option('b', "blocks",  RexchangeFixture::nblocks,        "number of blocks")
        >> Option('t', "thread",  RexchangeFixture::threads,        "number of threads")
        >> Option('m', "memory",  RexchangeFixture::mem_blocks,     "number of blocks to keep in memory")
        >> Option('h', "help",    help,                             "show help")
        ;

    if (!ops.parse(argc,argv) || help)
    {
        if (world.rank() == 0)
        {
            std::cout << "Usage: " << argv[0] << " [OPTIONS]\n";
            std::cout << "Sends and receives messages outside of the link.\n";
            std::cout << ops;
        }
        return 1;
    }

    return session.run();
}